

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pugixml.cpp
# Opt level: O2

xml_parse_result *
pugi::impl::anon_unknown_0::load_buffer_impl
          (xml_parse_result *__return_storage_ptr__,xml_document_struct *doc,xml_node_struct *root,
          void *contents,size_t size,uint options,xml_encoding encoding,bool is_mutable,bool own,
          char_t **out_buffer)

{
  byte bVar1;
  code *pcVar2;
  code *pcVar3;
  xml_parse_result *pxVar4;
  bool bVar5;
  xml_encoding xVar6;
  undefined4 extraout_var;
  value_type vVar7;
  char_t *pcVar8;
  value_type puVar9;
  value_type puVar10;
  size_t sVar11;
  size_t sVar12;
  xml_document_struct *node;
  xml_document_struct *pxVar13;
  xml_attribute_struct *pxVar14;
  char_t *pcVar15;
  xml_node_struct *pxVar16;
  xml_node_struct **ppxVar17;
  byte bVar18;
  byte bVar19;
  ushort uVar20;
  ushort *puVar21;
  char *pcVar22;
  long lVar23;
  byte *pbVar24;
  long lVar25;
  uint uVar26;
  xml_document_struct *alloc;
  ulong uVar27;
  xml_parse_status xVar28;
  long lVar29;
  byte bVar30;
  ushort uVar31;
  long lVar32;
  long lVar33;
  ushort *puVar34;
  size_t sVar35;
  byte *pbVar36;
  byte *pbVar37;
  byte *pbVar38;
  byte *pbVar39;
  xml_node_struct *prev_cursor;
  ulong uVar40;
  byte *pbVar41;
  long lStack_100;
  byte *local_e0;
  xml_document_struct *local_d8;
  ushort *local_d0;
  xml_parse_result *local_c8;
  size_t length;
  char_t *buffer;
  undefined8 local_b0;
  xml_parse_result result;
  byte *local_90;
  xml_node_struct *local_78;
  auto_deleter<void> contents_guard;
  
  if (size != 0 && contents == (void *)0x0) {
    xml_parse_result::xml_parse_result(__return_storage_ptr__);
    __return_storage_ptr__->status = status_io_error;
    __return_storage_ptr__->offset = 0;
    return __return_storage_ptr__;
  }
  local_d8 = doc;
  xVar6 = get_buffer_encoding(encoding,contents,size);
  local_b0 = CONCAT44(extraout_var,xVar6);
  contents_guard.data = (void *)0x0;
  if (own) {
    contents_guard.data = contents;
  }
  buffer = (char_t *)0x0;
  length = 0;
  contents_guard.deleter =
       (D)(anonymous_namespace)::xml_memory_management_function_storage<int>::deallocate;
  lVar23 = 1;
  local_d0 = (ushort *)contents;
  local_c8 = __return_storage_ptr__;
  if (xVar6 == encoding_utf8) {
LAB_0019c928:
    bVar5 = get_mutable_buffer(&buffer,&length,contents,size,is_mutable);
    if (bVar5) goto LAB_0019ce5a;
  }
  else if ((xVar6 & ~encoding_utf8) == encoding_utf16_le) {
    uVar40 = size >> 1;
    if (xVar6 == encoding_utf16_le) {
      lVar29 = 0;
      lVar25 = -1;
      puVar34 = (ushort *)contents;
      for (uVar27 = uVar40; uVar27 != 0; uVar27 = uVar27 + lVar33) {
        uVar20 = *puVar34;
        lVar33 = lVar25;
        if (uVar20 < 0xd800) {
          lVar32 = 3 - (ulong)(uVar20 < 0x800);
          if (uVar20 < 0x80) {
            lVar32 = lVar23;
          }
          lVar29 = lVar29 + lVar32;
LAB_0019c9dc:
          puVar21 = puVar34 + 1;
        }
        else {
          if ((~uVar20 & 0xe000) == 0) {
            lVar29 = lVar29 + 3;
            goto LAB_0019c9dc;
          }
          puVar21 = puVar34 + 1;
          if (((uVar27 != 1) && ((uVar20 & 0xfc00) == 0xd800)) && ((*puVar21 & 0xfc00) == 0xdc00)) {
            lVar29 = lVar29 + 4;
            puVar21 = puVar34 + 2;
            lVar33 = -2;
          }
        }
        puVar34 = puVar21;
      }
      sVar35 = lVar29 + 1;
      puVar9 = (value_type)
               (*(code *)(anonymous_namespace)::xml_memory_management_function_storage<int>::
                         allocate)(sVar35);
      if (puVar9 != (value_type)0x0) {
        lVar23 = -1;
        puVar10 = puVar9;
        puVar34 = local_d0;
        for (; uVar40 != 0; uVar40 = uVar40 + lStack_100) {
          uVar20 = *puVar34;
          uVar26 = (uint)uVar20;
          lStack_100 = lVar23;
          if ((uVar20 < 0xd800) || ((~uVar20 & 0xe000) == 0)) {
            puVar10 = utf8_writer::low(puVar10,uVar26);
            puVar21 = puVar34 + 1;
          }
          else {
            puVar21 = puVar34 + 1;
            if (((uVar40 != 1) && ((uVar26 & 0xfc00) == 0xd800)) && ((*puVar21 & 0xfc00) == 0xdc00))
            {
              puVar10 = utf8_writer::high(puVar10,(uVar26 & 0x3ff) * 0x400 + (*puVar21 & 0x3ff) +
                                                  0x10000);
              puVar21 = puVar34 + 2;
              lStack_100 = -2;
            }
          }
          puVar34 = puVar21;
        }
        if (puVar10 != puVar9 + lVar29) {
          pcVar22 = 
          "bool pugi::impl::(anonymous namespace)::convert_buffer_generic(char_t *&, size_t &, const void *, size_t, D) [D = pugi::impl::(anonymous namespace)::utf16_decoder<pugi::impl::(anonymous namespace)::opt_false>]"
          ;
LAB_0019dfdd:
          __assert_fail("oend == obegin + length",
                        "/workspace/llm4binary/github/license_c_cmakelists/quickfix[P]quickfix/src/C++/pugixml.cpp"
                        ,0x8b1,pcVar22);
        }
LAB_0019ce4d:
        *puVar10 = '\0';
        length = sVar35;
        buffer = (char_t *)puVar9;
LAB_0019ce5a:
        pcVar8 = buffer;
        contents_guard.data = (void *)0x0;
        if (own) {
          if (local_d0 != (ushort *)0x0 && (ushort *)buffer != local_d0) {
            (*(code *)(anonymous_namespace)::xml_memory_management_function_storage<int>::deallocate
            )(local_d0);
          }
LAB_0019ce9b:
          *out_buffer = pcVar8;
        }
        else if ((ushort *)buffer != local_d0) goto LAB_0019ce9b;
        sVar35 = length;
        local_d8->buffer = pcVar8;
        if (length != 0) {
          if (root->first_child == (xml_node_struct *)0x0) {
            local_78 = (xml_node_struct *)0x0;
          }
          else {
            local_78 = root->first_child->prev_sibling_c;
          }
          bVar1 = pcVar8[length - 1];
          pcVar8[length - 1] = '\0';
          local_90 = (byte *)pcVar8;
          if ((*pcVar8 == -0x11) && (pcVar8[1] == -0x45)) {
            local_90 = (byte *)(pcVar8 + (ulong)(pcVar8[2] == -0x41) * 3);
          }
          uVar40 = length - 1;
          pcVar2 = *(code **)((long)&PTR_parse_simple_001fd9b8 + (ulong)(options >> 1 & 0x78));
          pcVar3 = (code *)(&PTR_parse_001fda38)[options >> 9 & 4 | options >> 4 & 3];
          local_d0 = (ushort *)
                     CONCAT71(local_d0._1_7_,(options >> 0xb & 1) == 0 && (options & 0x408) != 0);
          bVar30 = bVar1 ^ 0x3e;
          alloc = (xml_document_struct *)&local_d8->super_xml_allocator;
          pbVar39 = local_90;
          node = (xml_document_struct *)root;
LAB_0019cfda:
          do {
            bVar18 = *pbVar39;
            while( true ) {
              pbVar37 = pbVar39;
              if (bVar18 == 0) goto LAB_0019dc78;
              if (bVar18 == 0x3c) goto LAB_0019d06f;
              lVar23 = 0;
              while (((anonymous_namespace)::chartype_table[bVar18] & 8) != 0) {
                bVar18 = pbVar37[lVar23 + 1];
                lVar23 = lVar23 + 1;
              }
              if ((bVar18 != 0x3c) && (bVar18 != 0)) break;
              if (lVar23 == 0) {
                __assert_fail("mark != s",
                              "/workspace/llm4binary/github/license_c_cmakelists/quickfix[P]quickfix/src/C++/pugixml.cpp"
                              ,0xd89,
                              "char_t *pugi::impl::(anonymous namespace)::xml_parser::parse_tree(char_t *, xml_node_struct *, unsigned int, char_t)"
                             );
              }
              pbVar39 = pbVar37 + lVar23;
              if (((char)local_d0 != '\0') &&
                 (((options >> 10 & 1) == 0 ||
                  (((bVar18 == 0x3c && (pbVar37[lVar23 + 1] == 0x2f)) &&
                   ((node->super_xml_node_struct).first_child == (xml_node_struct *)0x0)))))) break;
            }
            pbVar39 = pbVar37;
            if ((options >> 0xb & 1) != 0) {
              pbVar39 = pbVar37 + lVar23;
            }
            if (((options >> 0xc & 1) != 0) ||
               (pbVar37 = pbVar39, (node->super_xml_node_struct).parent != (xml_node_struct *)0x0))
            {
              pbVar37 = (byte *)(*pcVar3)(pbVar39);
              if ((((options >> 0xd & 1) == 0) ||
                  (((node->super_xml_node_struct).parent == (xml_node_struct *)0x0 ||
                   ((node->super_xml_node_struct).first_child != (xml_node_struct *)0x0)))) ||
                 ((node->super_xml_node_struct).value != (char_t *)0x0)) {
                if ((((options >> 0xe & 1) != 0) &&
                    (pxVar16 = (node->super_xml_node_struct).first_child,
                    pxVar16 != (xml_node_struct *)0x0)) &&
                   (pxVar16 = pxVar16->prev_sibling_c, (pxVar16->header & 0xf) == 3)) {
                  local_d8 = alloc;
                  if (local_90 < pxVar16->value) {
                    __assert_fail("merged_pcdata >= cursor->first_child->prev_sibling_c->value",
                                  "/workspace/llm4binary/github/license_c_cmakelists/quickfix[P]quickfix/src/C++/pugixml.cpp"
                                  ,0xda4,
                                  "char_t *pugi::impl::(anonymous namespace)::xml_parser::parse_tree(char_t *, xml_node_struct *, unsigned int, char_t)"
                                 );
                  }
                  sVar11 = strlength((char_t *)local_90);
                  sVar12 = strlen((char *)pbVar39);
                  memmove(local_90 + sVar11,pbVar39,sVar12 + 1);
                  alloc = local_d8;
                  local_90 = local_90 + sVar11 + sVar12;
                  goto LAB_0019d136;
                }
                pxVar16 = append_new_node(&node->super_xml_node_struct,(xml_allocator *)alloc,
                                          node_pcdata);
                if (pxVar16 != (xml_node_struct *)0x0) {
                  pxVar16->value = (char_t *)pbVar39;
                  local_90 = pbVar39;
                  goto LAB_0019d136;
                }
                goto LAB_0019dce9;
              }
              (node->super_xml_node_struct).value = (char_t *)pbVar39;
LAB_0019d136:
              bVar18 = *pbVar37;
              if (bVar18 != 0) goto LAB_0019d142;
LAB_0019dc78:
              pbVar41 = (byte *)0x0;
              if (node != (xml_document_struct *)root) {
                pbVar41 = pbVar37;
              }
              xVar28 = status_end_element_mismatch;
              if (node == (xml_document_struct *)root) {
                xVar28 = status_ok;
              }
              goto LAB_0019ddc4;
            }
            while( true ) {
              if (*pbVar37 == 0) goto LAB_0019dc78;
              if (*pbVar37 == 0x3c) break;
              pbVar37 = pbVar37 + 1;
            }
LAB_0019d06f:
            bVar18 = pbVar37[1];
            pbVar37 = pbVar37 + 1;
LAB_0019d142:
            if (-1 < (char)(anonymous_namespace)::chartype_table[bVar18]) {
              if (bVar18 == 0x21) {
                bVar18 = pbVar37[1];
                if (bVar18 == 0x5b) {
                  if (pbVar37[2] == 0x43) {
                    if (pbVar37[3] == 0x44) {
                      if (pbVar37[4] == 0x41) {
                        if (pbVar37[5] == 0x54) {
                          if (pbVar37[6] == 0x41) {
                            if (pbVar37[7] == 0x5b) {
                              pbVar37 = pbVar37 + 8;
                              pbVar41 = pbVar37;
                              if ((options & 4) == 0) {
                                do {
                                  if (*pbVar41 == 0x5d) {
                                    if (pbVar41[1] == 0x5d) {
                                      if ((pbVar41[2] == 0x3e) || (bVar30 == 0 && pbVar41[2] == 0))
                                      goto LAB_0019dbd8;
                                    }
                                  }
                                  else if (*pbVar41 == 0) goto LAB_0019ddb5;
                                  pbVar41 = pbVar41 + 1;
                                } while( true );
                              }
                              local_d8 = node;
                              pxVar16 = append_new_node(&node->super_xml_node_struct,
                                                        (xml_allocator *)alloc,node_cdata);
                              if (pxVar16 != (xml_node_struct *)0x0) {
                                pxVar16->value = (char_t *)pbVar37;
                                if ((options & 0x20) != 0) {
                                  result.status = status_ok;
                                  result._4_4_ = 0;
                                  result.offset = 0;
LAB_0019d926:
                                  do {
                                    while (bVar18 = *pbVar37,
                                          ((anonymous_namespace)::chartype_table[bVar18] & 0x10) ==
                                          0) {
                                      bVar18 = pbVar37[1];
                                      if (((anonymous_namespace)::chartype_table[bVar18] & 0x10) !=
                                          0) {
                                        pbVar37 = pbVar37 + 1;
                                        break;
                                      }
                                      bVar18 = pbVar37[2];
                                      if (((anonymous_namespace)::chartype_table[bVar18] & 0x10) !=
                                          0) {
                                        pbVar37 = pbVar37 + 2;
                                        break;
                                      }
                                      bVar18 = pbVar37[3];
                                      if (((anonymous_namespace)::chartype_table[bVar18] & 0x10) !=
                                          0) {
                                        pbVar37 = pbVar37 + 3;
                                        break;
                                      }
                                      pbVar37 = pbVar37 + 4;
                                    }
                                    if (bVar18 == 0xd) {
                                      local_e0 = pbVar37 + 1;
                                      *pbVar37 = 10;
                                      pbVar39 = pbVar37 + 1;
                                      pbVar37 = local_e0;
                                      if (*pbVar39 == 10) {
                                        gap::push((gap *)&result,(char_t **)&local_e0,1);
                                        pbVar37 = local_e0;
                                      }
                                      goto LAB_0019d926;
                                    }
                                    local_e0 = pbVar37;
                                    if (bVar18 == 0x5d) {
                                      if ((pbVar37[1] == 0x5d) &&
                                         ((pbVar37[2] == 0x3e || (bVar30 == 0 && pbVar37[2] == 0))))
                                      goto LAB_0019dbc4;
                                    }
                                    else if (bVar18 == 0) {
                                      pbVar41 = (byte *)pxVar16->value;
                                      goto LAB_0019ddb5;
                                    }
                                    pbVar37 = pbVar37 + 1;
                                  } while( true );
                                }
                                do {
                                  if (*pbVar41 == 0x5d) {
                                    if (pbVar41[1] == 0x5d) {
                                      if ((pbVar41[2] == 0x3e) || (bVar30 == 0 && pbVar41[2] == 0))
                                      goto LAB_0019dbb7;
                                    }
                                  }
                                  else if (*pbVar41 == 0) goto LAB_0019ddb5;
                                  pbVar41 = pbVar41 + 1;
                                } while( true );
                              }
                              goto LAB_0019dce9;
                            }
                            pbVar41 = pbVar37 + 7;
                          }
                          else {
                            pbVar41 = pbVar37 + 6;
                          }
                        }
                        else {
                          pbVar41 = pbVar37 + 5;
                        }
                      }
                      else {
                        pbVar41 = pbVar37 + 4;
                      }
                    }
                    else {
                      pbVar41 = pbVar37 + 3;
                    }
                  }
                  else {
                    pbVar41 = pbVar37 + 2;
                  }
LAB_0019ddb5:
                  xVar28 = status_bad_cdata;
                }
                else {
                  pbVar41 = pbVar37 + 1;
                  if (bVar18 == 0x44) {
                    if ((((pbVar37[2] == 0x4f) && (pbVar37[3] == 0x43)) && (pbVar37[4] == 0x54)) &&
                       ((pbVar37[5] == 0x59 && (pbVar37[6] == 0x50)))) {
                      if ((pbVar37[7] != 0x45) && (bVar1 != 0x45 || pbVar37[7] != 0))
                      goto LAB_0019dd06;
                      pbVar39 = pbVar37 + -1;
                      if ((node->super_xml_node_struct).parent == (xml_node_struct *)0x0) {
                        if ((*pbVar39 != 0x3c) && (*pbVar39 != 0)) {
                          __assert_fail("(s[0] == \'<\' || s[0] == 0) && s[1] == \'!\'",
                                        "/workspace/llm4binary/github/license_c_cmakelists/quickfix[P]quickfix/src/C++/pugixml.cpp"
                                        ,0xbda,
                                        "char_t *pugi::impl::(anonymous namespace)::xml_parser::parse_doctype_group(char_t *, char_t)"
                                       );
                        }
                        bVar18 = 0x44;
                        lVar23 = 0;
                        pbVar39 = pbVar41;
LAB_0019d620:
                        if ((bVar18 == 0x22) || (bVar18 == 0x27)) {
                          pbVar41 = pbVar39 + 1;
                          do {
                            pbVar39 = pbVar41;
                            bVar19 = *pbVar39;
                            pbVar41 = pbVar39 + 1;
                            if (bVar19 == 0) break;
                          } while (bVar19 != bVar18);
                          if (bVar19 == 0) goto LAB_0019ddbc;
                        }
                        else {
                          if (bVar18 == 0x3c) {
                            if (pbVar39[1] == 0x3f) {
                              pbVar39 = pbVar39 + 2;
                              do {
                                if (*pbVar39 == 0x3f) {
                                  if (pbVar39[1] == 0x3e) goto LAB_0019d71d;
                                }
                                else if (*pbVar39 == 0) goto LAB_0019ddbc;
                                pbVar39 = pbVar39 + 1;
                              } while( true );
                            }
                            if (pbVar39[1] == 0x21) {
                              if (pbVar39[2] != 0x2d) {
                                if (pbVar39[2] == 0x5b) {
                                  pbVar41 = pbVar39 + 3;
                                  lVar25 = 0;
LAB_0019d6a2:
                                  pbVar41 = pbVar41 + 3;
                                  do {
                                    bVar18 = pbVar41[-3];
                                    if (bVar18 == 0x3c) {
                                      if ((pbVar41[-2] == 0x21) && (pbVar41[-1] == 0x5b)) {
                                        lVar25 = lVar25 + 1;
                                        goto LAB_0019d6a2;
                                      }
                                    }
                                    else if (bVar18 == 0x5d) {
                                      if ((pbVar41[-2] == 0x5d) && (pbVar41[-1] == 0x3e))
                                      goto LAB_0019d6e6;
                                    }
                                    else if (bVar18 == 0) {
                                      pbVar39 = pbVar41 + -3;
                                      goto LAB_0019ddbc;
                                    }
                                    pbVar41 = pbVar41 + 1;
                                  } while( true );
                                }
                                pbVar41 = pbVar39 + 2;
                                lVar23 = lVar23 + 1;
                                goto LAB_0019d66a;
                              }
                              if (pbVar39[3] == 0x2d) {
                                pbVar39 = pbVar39 + 4;
                                do {
                                  if (*pbVar39 == 0x2d) {
                                    if ((pbVar39[1] == 0x2d) && (pbVar39[2] == 0x3e))
                                    goto LAB_0019d76a;
                                  }
                                  else if (*pbVar39 == 0) break;
                                  pbVar39 = pbVar39 + 1;
                                } while( true );
                              }
                            }
                            goto LAB_0019ddbc;
                          }
                          if (bVar18 == 0x3e) {
                            if (lVar23 == 0) goto LAB_0019dc09;
                            lVar23 = lVar23 + -1;
                          }
                          else if (bVar18 == 0) goto LAB_0019dbf5;
                          pbVar41 = pbVar39 + 1;
                        }
                        goto LAB_0019d66a;
                      }
                      goto LAB_0019ddbc;
                    }
LAB_0019dd06:
                    xVar28 = status_unrecognized_tag;
                  }
                  else if (bVar18 == 0x2d) {
                    if (pbVar37[2] == 0x2d) {
                      pbVar37 = pbVar37 + 3;
                      pxVar13 = node;
                      if ((options & 2) == 0) {
LAB_0019d359:
                        if ((options & 0x22) != 0x22) {
                          do {
                            if (*pbVar37 == 0x2d) {
                              if (pbVar37[1] == 0x2d) {
                                bVar18 = pbVar37[2];
                                if ((bVar18 == 0x3e) || (bVar30 == 0 && bVar18 == 0))
                                goto LAB_0019db2f;
                              }
                            }
                            else if (*pbVar37 == 0) goto LAB_0019dd92;
                            pbVar37 = pbVar37 + 1;
                          } while( true );
                        }
                        result.status = status_ok;
                        result._4_4_ = 0;
                        result.offset = 0;
LAB_0019d36c:
                        do {
                          while (bVar18 = *pbVar37,
                                ((anonymous_namespace)::chartype_table[bVar18] & 0x20) == 0) {
                            bVar18 = pbVar37[1];
                            if (((anonymous_namespace)::chartype_table[bVar18] & 0x20) != 0) {
                              pbVar37 = pbVar37 + 1;
                              break;
                            }
                            bVar18 = pbVar37[2];
                            if (((anonymous_namespace)::chartype_table[bVar18] & 0x20) != 0) {
                              pbVar37 = pbVar37 + 2;
                              break;
                            }
                            bVar18 = pbVar37[3];
                            if (((anonymous_namespace)::chartype_table[bVar18] & 0x20) != 0) {
                              pbVar37 = pbVar37 + 3;
                              break;
                            }
                            pbVar37 = pbVar37 + 4;
                          }
                          if (bVar18 == 0xd) {
                            local_e0 = pbVar37 + 1;
                            *pbVar37 = 10;
                            pbVar39 = pbVar37 + 1;
                            pbVar37 = local_e0;
                            if (*pbVar39 == 10) {
                              gap::push((gap *)&result,(char_t **)&local_e0,1);
                              pbVar37 = local_e0;
                            }
                            goto LAB_0019d36c;
                          }
                          local_e0 = pbVar37;
                          if (bVar18 == 0x2d) {
                            if ((pbVar37[1] == 0x2d) &&
                               ((pbVar37[2] == 0x3e || (bVar30 == 0 && pbVar37[2] == 0))))
                            goto LAB_0019db4f;
                          }
                          else if (bVar18 == 0) {
                            pbVar37 = (byte *)(pxVar13->super_xml_node_struct).value;
                            goto LAB_0019dd92;
                          }
                          pbVar37 = pbVar37 + 1;
                        } while( true );
                      }
                      pxVar13 = (xml_document_struct *)
                                append_new_node(&node->super_xml_node_struct,(xml_allocator *)alloc,
                                                node_comment);
                      if (pxVar13 != (xml_document_struct *)0x0) {
                        (pxVar13->super_xml_node_struct).value = (char_t *)pbVar37;
                        goto LAB_0019d359;
                      }
                      goto LAB_0019dce9;
                    }
                    pbVar37 = pbVar37 + 2;
LAB_0019dd92:
                    xVar28 = status_bad_comment;
                    pbVar41 = pbVar37;
                  }
                  else if ((bVar1 == 0x2d) && (bVar18 == 0)) {
                    xVar28 = status_bad_comment;
                  }
                  else {
                    xVar28 = (uint)(bVar1 == 0x5b && bVar18 == 0) * 3 + status_unrecognized_tag;
                  }
                }
              }
              else if (bVar18 == 0x3f) {
                pbVar36 = pbVar37 + 1;
                pbVar41 = pbVar36;
                if ((char)(anonymous_namespace)::chartype_table[pbVar37[1]] < '\0') {
                  lVar23 = 4;
                  pbVar41 = pbVar37 + 3;
                  lVar25 = 1;
                  pbVar38 = pbVar37 + 1;
                  do {
                    pbVar39 = pbVar38;
                    lVar29 = lVar25;
                    pbVar24 = pbVar41;
                    uVar27 = (ulong)*pbVar39;
                    pbVar38 = pbVar39 + 1;
                    lVar23 = lVar23 + -1;
                    pbVar41 = pbVar24 + 1;
                    lVar25 = lVar29 + 1;
                  } while (((anonymous_namespace)::chartype_table[uVar27] & 0x40) != 0);
                  pbVar41 = pbVar39;
                  local_d8 = alloc;
                  if (*pbVar39 == 0) goto LAB_0019dcd6;
                  pbVar41 = pbVar37 + lVar29;
                  if (((pbVar37[1] & 0xdf) == 0x58) && ((pbVar37[2] & 0xdf) == 0x4d)) {
                    bVar5 = (pbVar37[3] & 0xdf) != 0x4c;
                    uVar26 = 1;
                    if (lVar23 == 0 && !bVar5) {
                      uVar26 = 0x100;
                    }
                    if ((options & uVar26) == 0) {
LAB_0019d46e:
                      do {
                        if ((char)uVar27 == '?') {
                          bVar18 = pbVar39[1];
                          if ((bVar18 == 0x3e) || (bVar30 == 0 && bVar18 == 0)) goto LAB_0019d887;
                        }
                        else {
                          pbVar41 = pbVar39;
                          if ((int)uVar27 == 0) goto LAB_0019dcd6;
                          bVar18 = pbVar39[1];
                        }
                        uVar27 = (ulong)bVar18;
                        pbVar39 = pbVar39 + 1;
                      } while( true );
                    }
                    if (lVar23 != 0 || bVar5) goto LAB_0019d53a;
                    if ((node->super_xml_node_struct).parent != (xml_node_struct *)0x0)
                    goto LAB_0019dcd6;
                    node = (xml_document_struct *)
                           append_new_node(&node->super_xml_node_struct,(xml_allocator *)alloc,
                                           node_declaration);
                    pbVar37 = pbVar41;
                    if (node == (xml_document_struct *)0x0) goto LAB_0019dce9;
                    bVar5 = true;
                  }
                  else {
                    if ((options & 1) == 0) goto LAB_0019d46e;
LAB_0019d53a:
                    node = (xml_document_struct *)
                           append_new_node(&node->super_xml_node_struct,(xml_allocator *)alloc,
                                           node_pi);
                    pbVar37 = pbVar41;
                    if (node == (xml_document_struct *)0x0) goto LAB_0019dce9;
                    bVar5 = false;
                  }
                  (node->super_xml_node_struct).name = (char_t *)pbVar36;
                  bVar18 = *pbVar39;
                  *pbVar39 = 0;
                  if ((ulong)bVar18 != 0x3f) {
                    pbVar41 = pbVar38;
                    if (((anonymous_namespace)::chartype_table[bVar18] & 8) != 0) {
                      do {
                        pbVar37 = pbVar24;
                        uVar27 = (ulong)pbVar39[1];
                        pbVar39 = pbVar39 + 1;
                        pbVar24 = pbVar37 + 1;
                      } while (((anonymous_namespace)::chartype_table[uVar27] & 8) != 0);
                      do {
                        if ((char)uVar27 == '?') {
                          bVar18 = *pbVar37;
                          if ((bVar18 == 0x3e) || (bVar30 == 0 && bVar18 == 0)) goto LAB_0019d90c;
                        }
                        else {
                          if ((int)uVar27 == 0) {
                            pbVar41 = pbVar37 + -1;
                            break;
                          }
                          bVar18 = *pbVar37;
                        }
                        uVar27 = (ulong)bVar18;
                        pbVar37 = pbVar37 + 1;
                      } while( true );
                    }
                    goto LAB_0019dcd6;
                  }
                  bVar18 = *pbVar38;
                  if ((bVar18 != 0x3e) && (bVar30 != 0 || bVar18 != 0)) {
                    pbVar41 = pbVar41 + 1;
                    goto LAB_0019dcd6;
                  }
                  pbVar39 = pbVar38 + (bVar18 == 0x3e);
                  node = (xml_document_struct *)(node->super_xml_node_struct).parent;
                  goto LAB_0019da06;
                }
LAB_0019dcd6:
                xVar28 = status_bad_pi;
              }
              else if (bVar18 == 0x2f) {
                pbVar37 = pbVar37 + 1;
                pbVar39 = (byte *)(node->super_xml_node_struct).name;
                pbVar36 = pbVar37;
                if (pbVar39 == (byte *)0x0) {
LAB_0019dcbb:
                  xVar28 = status_end_element_mismatch;
                  pbVar41 = pbVar37;
                }
                else {
                  while (bVar18 = *pbVar36,
                        ((anonymous_namespace)::chartype_table[bVar18] & 0x40) != 0) {
                    bVar19 = *pbVar39;
                    pbVar39 = pbVar39 + 1;
                    pbVar36 = pbVar36 + 1;
                    if (bVar18 != bVar19) goto LAB_0019dcbb;
                  }
                  if (*pbVar39 == 0) goto code_r0x0019d4ad;
                  xVar28 = status_bad_end_element;
                  if (((bVar18 != 0) || (*pbVar39 != bVar1)) || (pbVar41 = pbVar36, pbVar39[1] != 0)
                     ) {
                    xVar28 = status_end_element_mismatch;
                    pbVar41 = pbVar37;
                  }
                }
              }
              else {
                xVar28 = (bVar1 == 0x3f && bVar18 == 0) + status_unrecognized_tag;
                pbVar41 = pbVar37;
              }
              goto LAB_0019ddc4;
            }
            node = (xml_document_struct *)
                   append_new_node(&node->super_xml_node_struct,(xml_allocator *)alloc,node_element)
            ;
            if (node == (xml_document_struct *)0x0) goto LAB_0019dce9;
            (node->super_xml_node_struct).name = (char_t *)pbVar37;
            pbVar39 = pbVar37 + 1;
            do {
              pbVar37 = pbVar39;
              uVar27 = (ulong)pbVar37[-1];
              bVar18 = (anonymous_namespace)::chartype_table[uVar27];
              if ((bVar18 & 0x40) == 0) {
                pbVar37 = pbVar37 + -1;
                goto LAB_0019d4e0;
              }
              uVar27 = (ulong)*pbVar37;
              bVar18 = (anonymous_namespace)::chartype_table[uVar27];
              if ((bVar18 & 0x40) == 0) goto LAB_0019d4e0;
              uVar27 = (ulong)pbVar37[1];
              bVar18 = (anonymous_namespace)::chartype_table[uVar27];
              if ((bVar18 & 0x40) == 0) {
                pbVar37 = pbVar37 + 1;
                goto LAB_0019d4e0;
              }
              uVar27 = (ulong)pbVar37[2];
              bVar18 = (anonymous_namespace)::chartype_table[uVar27];
              pbVar39 = pbVar37 + 4;
            } while ((bVar18 & 0x40) != 0);
            pbVar37 = pbVar37 + 2;
LAB_0019d4e0:
            *pbVar37 = 0;
            pbVar39 = pbVar37 + 1;
          } while ((char)uVar27 == '>');
          if ((bVar18 & 8) != 0) goto LAB_0019da1e;
          if ((char)uVar27 == '\0') {
            pbVar39 = pbVar37;
            if (bVar1 == 0x3e) goto LAB_0019cfda;
          }
          else {
            pbVar37 = pbVar39;
            if ((int)uVar27 == 0x2f) {
              bVar18 = *pbVar39;
              if ((bVar18 != 0x3e) && (bVar30 != 0 || bVar18 != 0)) goto LAB_0019df1c;
              node = (xml_document_struct *)(node->super_xml_node_struct).parent;
              pbVar39 = pbVar39 + (bVar18 == 0x3e);
              goto LAB_0019cfda;
            }
          }
          goto LAB_0019df1c;
        }
        xml_parse_result::xml_parse_result(local_c8);
        local_c8->status = ~options >> 8 & status_no_document_element;
        local_c8->offset = 0;
        goto LAB_0019de52;
      }
    }
    else {
      lVar25 = -1;
      lVar29 = 0;
      puVar34 = (ushort *)contents;
      for (uVar27 = uVar40; uVar27 != 0; uVar27 = uVar27 + lVar33) {
        uVar20 = *puVar34 << 8;
        uVar31 = uVar20 | *puVar34 >> 8;
        lVar33 = lVar25;
        if (uVar31 < 0xd800) {
          lVar32 = 3 - (ulong)(uVar31 < 0x800);
          if (uVar31 < 0x80) {
            lVar32 = lVar23;
          }
          lVar29 = lVar29 + lVar32;
LAB_0019caef:
          puVar21 = puVar34 + 1;
        }
        else {
          if ((~uVar31 & 0xe000) == 0) {
            lVar29 = lVar29 + 3;
            goto LAB_0019caef;
          }
          puVar21 = puVar34 + 1;
          if (((uVar27 != 1) && ((uVar20 & 0xfc00) == 0xd800)) && ((*puVar21 & 0xfc) == 0xdc)) {
            lVar29 = lVar29 + 4;
            puVar21 = puVar34 + 2;
            lVar33 = -2;
          }
        }
        puVar34 = puVar21;
      }
      puVar9 = (value_type)
               (*(code *)(anonymous_namespace)::xml_memory_management_function_storage<int>::
                         allocate)(lVar29 + 1U);
      if (puVar9 != (value_type)0x0) {
        lVar23 = -1;
        puVar10 = puVar9;
        puVar34 = local_d0;
        for (; uVar40 != 0; uVar40 = uVar40 + lStack_100) {
          uVar20 = *puVar34 << 8 | *puVar34 >> 8;
          uVar26 = (uint)uVar20;
          lStack_100 = lVar23;
          if ((uVar20 < 0xd800) || ((~uVar26 & 0xe000) == 0)) {
            puVar10 = utf8_writer::low(puVar10,uVar26);
            puVar21 = puVar34 + 1;
          }
          else {
            puVar21 = puVar34 + 1;
            if (((uVar40 != 1) && ((uVar26 & 0xfc00) == 0xd800)) &&
               (uVar26 = (uint)(ushort)(*puVar21 << 8 | *puVar21 >> 8), (uVar26 & 0xfc00) == 0xdc00)
               ) {
              puVar10 = utf8_writer::high(puVar10,(uVar20 & 0x3ff) * 0x400 + (uVar26 & 0x3ff) +
                                                  0x10000);
              puVar21 = puVar34 + 2;
              lStack_100 = -2;
            }
          }
          puVar34 = puVar21;
        }
        if (puVar10 != puVar9 + lVar29) {
          pcVar22 = 
          "bool pugi::impl::(anonymous namespace)::convert_buffer_generic(char_t *&, size_t &, const void *, size_t, D) [D = pugi::impl::(anonymous namespace)::utf16_decoder<pugi::impl::(anonymous namespace)::opt_true>]"
          ;
          goto LAB_0019dfdd;
        }
        *puVar10 = '\0';
        length = lVar29 + 1U;
        buffer = (char_t *)puVar9;
        goto LAB_0019ce5a;
      }
    }
  }
  else {
    if (1 < xVar6 - encoding_utf32_le) {
      if (xVar6 != encoding_latin1) {
        __assert_fail("false && \"Invalid encoding\"",
                      "/workspace/llm4binary/github/license_c_cmakelists/quickfix[P]quickfix/src/C++/pugixml.cpp"
                      ,0x906,
                      "bool pugi::impl::(anonymous namespace)::convert_buffer(char_t *&, size_t &, xml_encoding, const void *, size_t, bool)"
                     );
      }
      lVar23 = 0;
      pcVar22 = (char *)contents;
LAB_0019cc08:
      if (size + lVar23 != 0) {
        if (-1 < *pcVar22) goto code_r0x0019cc1d;
        lVar25 = 0;
        sVar35 = -lVar23;
        for (sVar12 = sVar35; size != sVar12; sVar12 = sVar12 + 1) {
          lVar25 = (lVar25 - (ulong)(-1 < *(char *)((long)contents + sVar12))) + 2;
        }
        sVar11 = (lVar25 - lVar23) + 1;
        pcVar8 = (char_t *)
                 (*(code *)(anonymous_namespace)::xml_memory_management_function_storage<int>::
                           allocate)(sVar11);
        if (pcVar8 != (char_t *)0x0) {
          memcpy(pcVar8,local_d0,sVar35);
          puVar9 = (value_type)(pcVar8 + -lVar23);
          for (; size != sVar35; sVar35 = sVar35 + 1) {
            puVar9 = utf8_writer::low(puVar9,(uint)*(byte *)((long)local_d0 + sVar35));
          }
          if ((value_type)(pcVar8 + (lVar25 - lVar23)) != puVar9) {
            __assert_fail("oend == obegin + length",
                          "/workspace/llm4binary/github/license_c_cmakelists/quickfix[P]quickfix/src/C++/pugixml.cpp"
                          ,0x8df,
                          "bool pugi::impl::(anonymous namespace)::convert_buffer_latin1(char_t *&, size_t &, const void *, size_t, bool)"
                         );
          }
          *puVar9 = '\0';
          length = sVar11;
          buffer = pcVar8;
          goto LAB_0019ce5a;
        }
        goto LAB_0019c94e;
      }
      goto LAB_0019c928;
    }
    uVar40 = size >> 2;
    if (xVar6 == encoding_utf32_le) {
      vVar7 = utf32_decoder<pugi::impl::(anonymous_namespace)::opt_false>::
              process<pugi::impl::(anonymous_namespace)::utf8_counter>(contents,uVar40);
      pcVar8 = (char_t *)
               (*(code *)(anonymous_namespace)::xml_memory_management_function_storage<int>::
                         allocate)(vVar7 + 1);
      if (pcVar8 != (char_t *)0x0) {
        puVar9 = utf32_decoder<pugi::impl::(anonymous_namespace)::opt_false>::
                 process<pugi::impl::(anonymous_namespace)::utf8_writer>(local_d0,uVar40,pcVar8);
        if (puVar9 != (value_type)(pcVar8 + vVar7)) {
          pcVar22 = 
          "bool pugi::impl::(anonymous namespace)::convert_buffer_generic(char_t *&, size_t &, const void *, size_t, D) [D = pugi::impl::(anonymous namespace)::utf32_decoder<pugi::impl::(anonymous namespace)::opt_false>]"
          ;
          goto LAB_0019dfdd;
        }
        *puVar9 = '\0';
        length = vVar7 + 1;
        buffer = pcVar8;
        goto LAB_0019ce5a;
      }
    }
    else {
      lVar25 = 0;
      for (uVar27 = 0; uVar40 != uVar27; uVar27 = uVar27 + 1) {
        uVar26 = *(uint *)((long)contents + uVar27 * 4);
        uVar26 = uVar26 >> 0x18 | (uVar26 & 0xff0000) >> 8 | (uVar26 & 0xff00) << 8 | uVar26 << 0x18
        ;
        if (uVar26 < 0x10000) {
          lVar29 = 3 - (ulong)(uVar26 < 0x800);
          if (uVar26 < 0x80) {
            lVar29 = lVar23;
          }
          lVar25 = lVar25 + lVar29;
        }
        else {
          lVar25 = lVar25 + 4;
        }
      }
      sVar35 = lVar25 + 1;
      puVar9 = (value_type)
               (*(code *)(anonymous_namespace)::xml_memory_management_function_storage<int>::
                         allocate)(sVar35);
      if (puVar9 != (value_type)0x0) {
        puVar10 = puVar9;
        for (uVar27 = 0; uVar40 != uVar27; uVar27 = uVar27 + 1) {
          uVar26 = *(uint *)(local_d0 + uVar27 * 2);
          uVar26 = uVar26 >> 0x18 | (uVar26 & 0xff0000) >> 8 | (uVar26 & 0xff00) << 8 |
                   uVar26 << 0x18;
          if (uVar26 < 0x10000) {
            puVar10 = utf8_writer::low(puVar10,uVar26);
          }
          else {
            puVar10 = utf8_writer::high(puVar10,uVar26);
          }
        }
        if (puVar10 != puVar9 + lVar25) {
          pcVar22 = 
          "bool pugi::impl::(anonymous namespace)::convert_buffer_generic(char_t *&, size_t &, const void *, size_t, D) [D = pugi::impl::(anonymous namespace)::utf32_decoder<pugi::impl::(anonymous namespace)::opt_true>]"
          ;
          goto LAB_0019dfdd;
        }
        goto LAB_0019ce4d;
      }
    }
  }
LAB_0019c94e:
  xml_parse_result::xml_parse_result(local_c8);
  local_c8->status = status_out_of_memory;
  local_c8->offset = 0;
  goto LAB_0019deb2;
code_r0x0019cc1d:
  lVar23 = lVar23 + -1;
  pcVar22 = pcVar22 + 1;
  goto LAB_0019cc08;
LAB_0019dbc4:
  pcVar15 = gap::flush((gap *)&result,(char_t *)pbVar37);
  *pcVar15 = '\0';
  pbVar41 = pbVar37;
  node = local_d8;
  goto LAB_0019dbd8;
LAB_0019dbb7:
  *pbVar41 = 0;
  node = local_d8;
LAB_0019dbd8:
  local_d8 = node;
  pbVar39 = pbVar41 + (ulong)(pbVar41[2] == 0x3e) + 2;
  node = local_d8;
  goto LAB_0019cfda;
LAB_0019dbf5:
  if ((bVar1 != 0x3e) || (lVar23 != 0)) {
LAB_0019ddbc:
    xVar28 = status_bad_doctype;
    pbVar41 = pbVar39;
    goto LAB_0019ddc4;
  }
LAB_0019dc09:
  if ((bVar18 != 0x3e) && (bVar30 != 0 || bVar18 != 0)) {
    __assert_fail("(*s == 0 && endch == \'>\') || *s == \'>\'",
                  "/workspace/llm4binary/github/license_c_cmakelists/quickfix[P]quickfix/src/C++/pugixml.cpp"
                  ,0xc5e,
                  "char_t *pugi::impl::(anonymous namespace)::xml_parser::parse_exclamation(char_t *, xml_node_struct *, unsigned int, char_t)"
                 );
  }
  if (bVar18 != 0) {
    *pbVar39 = 0;
    pbVar39 = pbVar39 + 1;
  }
  if ((options >> 9 & 1) != 0) {
    pbVar41 = pbVar37 + 7;
    do {
      pbVar37 = pbVar41 + 1;
      pbVar41 = pbVar41 + 1;
    } while (((anonymous_namespace)::chartype_table[*pbVar37] & 8) != 0);
    pxVar16 = append_new_node(&node->super_xml_node_struct,(xml_allocator *)alloc,node_doctype);
    pbVar37 = pbVar39;
    if (pxVar16 == (xml_node_struct *)0x0) {
LAB_0019dce9:
      xVar28 = status_out_of_memory;
      pbVar41 = pbVar37;
      goto LAB_0019ddc4;
    }
    pxVar16->value = (char_t *)pbVar41;
  }
  goto LAB_0019cfda;
LAB_0019d71d:
  pbVar41 = pbVar39 + 2;
  goto LAB_0019d66a;
LAB_0019d76a:
  pbVar41 = pbVar39 + 3;
LAB_0019d66a:
  bVar18 = *pbVar41;
  pbVar39 = pbVar41;
  goto LAB_0019d620;
LAB_0019d6e6:
  if (lVar25 != 0) {
    lVar25 = lVar25 + -1;
    goto LAB_0019d6a2;
  }
  goto LAB_0019d66a;
LAB_0019db2f:
  if ((options & 2) != 0) {
    *pbVar37 = 0;
  }
  pbVar39 = pbVar37 + (ulong)(bVar18 == 0x3e) + 2;
  goto LAB_0019cfda;
LAB_0019db4f:
  pcVar15 = gap::flush((gap *)&result,(char_t *)pbVar37);
  *pcVar15 = '\0';
  pbVar39 = pbVar37 + (ulong)(pbVar37[2] == 0x3e) + 2;
  goto LAB_0019cfda;
LAB_0019d887:
  pbVar39 = pbVar39 + (ulong)(bVar18 == 0x3e) + 1;
LAB_0019da06:
  if (node == (xml_document_struct *)0x0) {
    __assert_fail("cursor",
                  "/workspace/llm4binary/github/license_c_cmakelists/quickfix[P]quickfix/src/C++/pugixml.cpp"
                  ,0xd75,
                  "char_t *pugi::impl::(anonymous namespace)::xml_parser::parse_tree(char_t *, xml_node_struct *, unsigned int, char_t)"
                 );
  }
  goto LAB_0019da0f;
LAB_0019d90c:
  if (!bVar5) {
    (node->super_xml_node_struct).value = (char_t *)pbVar39;
    node = (xml_document_struct *)(node->super_xml_node_struct).parent;
    pbVar37[-1] = 0;
    pbVar39 = pbVar37 + (*pbVar37 == 0x3e);
    goto LAB_0019da06;
  }
  pbVar37[-1] = 0x2f;
LAB_0019da0f:
  alloc = local_d8;
  if (((node->super_xml_node_struct).header & 0xf) != 7) goto LAB_0019cfda;
LAB_0019da1e:
  while( true ) {
    do {
      pbVar37 = pbVar39;
      bVar18 = *pbVar37;
      pbVar39 = pbVar37 + 1;
    } while (((anonymous_namespace)::chartype_table[bVar18] & 8) != 0);
    if (-1 < (char)(anonymous_namespace)::chartype_table[bVar18]) break;
    pxVar14 = append_new_attribute(&node->super_xml_node_struct,(xml_allocator *)alloc);
    if (pxVar14 == (xml_attribute_struct *)0x0) goto LAB_0019dce9;
    pxVar14->name = (char_t *)pbVar37;
    pbVar37 = pbVar37 + 1;
    do {
      pbVar39 = pbVar37;
      bVar18 = pbVar39[-1];
      bVar19 = (anonymous_namespace)::chartype_table[bVar18];
      if ((bVar19 & 0x40) == 0) {
        pbVar39 = pbVar39 + -1;
        goto LAB_0019da9c;
      }
      bVar18 = *pbVar39;
      bVar19 = (anonymous_namespace)::chartype_table[bVar18];
      if ((bVar19 & 0x40) == 0) goto LAB_0019da9c;
      bVar18 = pbVar39[1];
      bVar19 = (anonymous_namespace)::chartype_table[bVar18];
      if ((bVar19 & 0x40) == 0) {
        pbVar39 = pbVar39 + 1;
        goto LAB_0019da9c;
      }
      bVar18 = pbVar39[2];
      bVar19 = (anonymous_namespace)::chartype_table[bVar18];
      pbVar37 = pbVar39 + 4;
    } while ((bVar19 & 0x40) != 0);
    pbVar39 = pbVar39 + 2;
LAB_0019da9c:
    *pbVar39 = 0;
    while (pbVar39 = pbVar39 + 1, (bVar19 & 8) != 0) {
      bVar18 = *pbVar39;
      bVar19 = (anonymous_namespace)::chartype_table[bVar18];
    }
    pbVar37 = pbVar39;
    if (bVar18 != 0x3d) goto LAB_0019dcf6;
    do {
      pbVar39 = pbVar37;
      bVar18 = *pbVar39;
      pbVar37 = pbVar39 + 1;
    } while (((anonymous_namespace)::chartype_table[bVar18] & 8) != 0);
    if ((bVar18 != 0x22) && (bVar18 != 0x27)) goto LAB_0019dcf6;
    pxVar14->value = (char_t *)pbVar37;
    pbVar39 = (byte *)(*pcVar2)(pbVar37,(int)(char)bVar18);
    if (pbVar39 == (byte *)0x0) {
      pbVar39 = (byte *)pxVar14->value;
      goto LAB_0019dcf6;
    }
    if ((char)(anonymous_namespace)::chartype_table[*pbVar39] < '\0') {
LAB_0019dcf6:
      xVar28 = status_bad_attribute;
      pbVar41 = pbVar39;
      goto LAB_0019ddc4;
    }
  }
  if (bVar18 == 0x3e) goto LAB_0019cfda;
  if (bVar18 == 0x2f) {
    if (*pbVar39 == 0x3e) {
      node = (xml_document_struct *)(node->super_xml_node_struct).parent;
      pbVar39 = pbVar37 + 2;
      goto LAB_0019cfda;
    }
    pbVar37 = pbVar39;
    if ((bVar1 == 0x3e) && (*pbVar39 == 0)) {
      node = (xml_document_struct *)(node->super_xml_node_struct).parent;
      goto LAB_0019cfda;
    }
  }
  else if ((bVar1 == 0x3e) && (pbVar39 = pbVar37, bVar18 == 0)) goto LAB_0019cfda;
LAB_0019df1c:
  xVar28 = status_bad_start_element;
  pbVar41 = pbVar37;
  goto LAB_0019ddc4;
code_r0x0019d4ad:
  node = (xml_document_struct *)(node->super_xml_node_struct).parent;
  do {
    pbVar41 = pbVar36;
    bVar18 = *pbVar41;
    pbVar36 = pbVar41 + 1;
  } while (((anonymous_namespace)::chartype_table[bVar18] & 8) != 0);
  pbVar39 = pbVar41;
  bVar19 = bVar1;
  if (bVar18 != 0) {
    pbVar39 = pbVar41 + 1;
    bVar19 = bVar18;
  }
  if (bVar19 != 0x3e) goto LAB_0019df0c;
  goto LAB_0019cfda;
LAB_0019df0c:
  xVar28 = status_bad_end_element;
LAB_0019ddc4:
  uVar27 = (long)pbVar41 - (long)pcVar8;
  if (pbVar41 == (byte *)0x0) {
    uVar27 = 0;
  }
  xml_parse_result::xml_parse_result(&result);
  result.status = xVar28;
  result.offset = uVar27;
  if (((long)uVar27 < 0) || (sVar35 < uVar27)) {
    __assert_fail("result.offset >= 0 && static_cast<size_t>(result.offset) <= length",
                  "/workspace/llm4binary/github/license_c_cmakelists/quickfix[P]quickfix/src/C++/pugixml.cpp"
                  ,0xdff,
                  "static xml_parse_result pugi::impl::(anonymous namespace)::xml_parser::parse(char_t *, size_t, xml_document_struct *, xml_node_struct *, unsigned int)"
                 );
  }
  xVar6 = (xml_encoding)local_b0;
  if (xVar28 == status_ok) {
    if (bVar1 != 0x3c) {
      if ((options >> 0xc & 1) == 0) {
        ppxVar17 = &local_78->next_sibling;
        if (local_78 == (xml_node_struct *)0x0) {
          ppxVar17 = &root->first_child;
        }
        do {
          pxVar16 = *ppxVar17;
          if (pxVar16 == (xml_node_struct *)0x0) {
            xml_parse_result::xml_parse_result(local_c8);
            local_c8->status = status_no_document_element;
            local_c8->offset = uVar40;
            goto LAB_0019deae;
          }
          ppxVar17 = &pxVar16->next_sibling;
        } while ((pxVar16->header & 0xf) != 2);
      }
      goto LAB_0019de94;
    }
    xml_parse_result::xml_parse_result(local_c8);
    local_c8->status = status_unrecognized_tag;
    local_c8->offset = uVar40;
LAB_0019de52:
    xVar6 = (xml_encoding)local_b0;
  }
  else {
    if (((uVar27 != 0) && (uVar27 == uVar40)) && (bVar1 == 0)) {
      result.offset = sVar35 - 2;
    }
LAB_0019de94:
    local_c8->encoding = result.encoding;
    *(undefined4 *)&local_c8->field_0x14 = result._20_4_;
    local_c8->status = xVar28;
    *(undefined4 *)&local_c8->field_0x4 = result._4_4_;
    local_c8->offset = result.offset;
  }
LAB_0019deae:
  local_c8->encoding = xVar6;
LAB_0019deb2:
  pxVar4 = local_c8;
  auto_deleter<void>::~auto_deleter(&contents_guard);
  return pxVar4;
}

Assistant:

PUGI_IMPL_FN xml_parse_result load_buffer_impl(xml_document_struct* doc, xml_node_struct* root, void* contents, size_t size, unsigned int options, xml_encoding encoding, bool is_mutable, bool own, char_t** out_buffer)
	{
		// check input buffer
		if (!contents && size) return make_parse_result(status_io_error);

		// get actual encoding
		xml_encoding buffer_encoding = impl::get_buffer_encoding(encoding, contents, size);

		// if convert_buffer below throws bad_alloc, we still need to deallocate contents if we own it
		auto_deleter<void> contents_guard(own ? contents : NULL, xml_memory::deallocate);

		// get private buffer
		char_t* buffer = NULL;
		size_t length = 0;

		// coverity[var_deref_model]
		if (!impl::convert_buffer(buffer, length, buffer_encoding, contents, size, is_mutable)) return impl::make_parse_result(status_out_of_memory);

		// after this we either deallocate contents (below) or hold on to it via doc->buffer, so we don't need to guard it
		contents_guard.release();

		// delete original buffer if we performed a conversion
		if (own && buffer != contents && contents) impl::xml_memory::deallocate(contents);

		// grab onto buffer if it's our buffer, user is responsible for deallocating contents himself
		if (own || buffer != contents) *out_buffer = buffer;

		// store buffer for offset_debug
		doc->buffer = buffer;

		// parse
		xml_parse_result res = impl::xml_parser::parse(buffer, length, doc, root, options);

		// remember encoding
		res.encoding = buffer_encoding;

		return res;
	}